

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.cpp
# Opt level: O2

void fp::API::setText(int x,int y,string *text)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"setText ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,x);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,y);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)text);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void fp::API::setText(int x, int y, const std::string &text) {
    std::cout << "setText " << x << " " << y << " " << text << std::endl;
}